

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O2

void ihevc_intra_pred_ref_filtering_sse42
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  uint uVar22;
  byte *pbVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  undefined1 in_XMM0 [16];
  undefined1 auVar29 [16];
  ushort uVar30;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  undefined1 auVar31 [16];
  ushort uVar38;
  ushort uVar39;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar40 [16];
  ushort uVar47;
  undefined1 auVar48 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar49 [16];
  byte local_118;
  undefined1 auStack_117 [2];
  char acStack_115 [5];
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  
  lVar25 = (long)nt;
  uVar19 = lVar25 * 4;
  iVar3 = 0;
  if (nt != 0) {
    for (; ((uint)nt >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
    }
  }
  uVar27 = 1 << ((char)iVar3 - 2U & 0x1f);
  if (nt == 0) {
    uVar27 = 0;
  }
  if ((uVar27 & "\x0e"[mode]) == 0) {
    if (pu1_src == pu1_dst) {
      return;
    }
    switch(nt << 0x1e | nt - 4U >> 2) {
    case 0:
      uVar4 = *(undefined8 *)(pu1_src + 8);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar4;
      break;
    case 1:
      uVar4 = *(undefined8 *)(pu1_src + 8);
      uVar5 = *(undefined8 *)(pu1_src + 0x10);
      uVar6 = *(undefined8 *)(pu1_src + 0x18);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar4;
      *(undefined8 *)(pu1_dst + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + 0x18) = uVar6;
      break;
    default:
      goto switchD_0014a54e_caseD_2;
    case 3:
      uVar4 = *(undefined8 *)(pu1_src + 8);
      uVar5 = *(undefined8 *)(pu1_src + 0x10);
      uVar6 = *(undefined8 *)(pu1_src + 0x18);
      uVar7 = *(undefined8 *)(pu1_src + 0x20);
      uVar8 = *(undefined8 *)(pu1_src + 0x28);
      uVar9 = *(undefined8 *)(pu1_src + 0x30);
      uVar10 = *(undefined8 *)(pu1_src + 0x38);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar4;
      *(undefined8 *)(pu1_dst + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + 0x18) = uVar6;
      *(undefined8 *)(pu1_dst + 0x20) = uVar7;
      *(undefined8 *)(pu1_dst + 0x28) = uVar8;
      *(undefined8 *)(pu1_dst + 0x30) = uVar9;
      *(undefined8 *)(pu1_dst + 0x38) = uVar10;
      break;
    case 7:
      uVar4 = *(undefined8 *)(pu1_src + 8);
      uVar5 = *(undefined8 *)(pu1_src + 0x10);
      uVar6 = *(undefined8 *)(pu1_src + 0x18);
      uVar7 = *(undefined8 *)(pu1_src + 0x20);
      uVar8 = *(undefined8 *)(pu1_src + 0x28);
      uVar9 = *(undefined8 *)(pu1_src + 0x30);
      uVar10 = *(undefined8 *)(pu1_src + 0x38);
      uVar11 = *(undefined8 *)(pu1_src + 0x40);
      uVar12 = *(undefined8 *)(pu1_src + 0x48);
      uVar13 = *(undefined8 *)(pu1_src + 0x50);
      uVar14 = *(undefined8 *)(pu1_src + 0x58);
      uVar15 = *(undefined8 *)(pu1_src + 0x60);
      uVar16 = *(undefined8 *)(pu1_src + 0x68);
      uVar17 = *(undefined8 *)(pu1_src + 0x70);
      uVar18 = *(undefined8 *)(pu1_src + 0x78);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar4;
      *(undefined8 *)(pu1_dst + 0x10) = uVar5;
      *(undefined8 *)(pu1_dst + 0x18) = uVar6;
      *(undefined8 *)(pu1_dst + 0x20) = uVar7;
      *(undefined8 *)(pu1_dst + 0x28) = uVar8;
      *(undefined8 *)(pu1_dst + 0x30) = uVar9;
      *(undefined8 *)(pu1_dst + 0x38) = uVar10;
      *(undefined8 *)(pu1_dst + 0x40) = uVar11;
      *(undefined8 *)(pu1_dst + 0x48) = uVar12;
      *(undefined8 *)(pu1_dst + 0x50) = uVar13;
      *(undefined8 *)(pu1_dst + 0x58) = uVar14;
      *(undefined8 *)(pu1_dst + 0x60) = uVar15;
      *(undefined8 *)(pu1_dst + 0x68) = uVar16;
      *(undefined8 *)(pu1_dst + 0x70) = uVar17;
      *(undefined8 *)(pu1_dst + 0x78) = uVar18;
    }
    uVar19 = uVar19 & 0xffffffff;
    pbVar23 = pu1_src + uVar19;
  }
  else {
    bVar1 = *pu1_src;
    bVar21 = true;
    uVar27 = (uint)bVar1;
    if (nt == 0x20 && strong_intra_smoothing_enable_flag == 1) {
      uVar24 = (uint)pu1_src[uVar19 & 0xffffffff] + (uint)pu1_src[0x40] + (uint)pu1_src[0x60] * -2;
      uVar22 = -uVar24;
      if (0 < (int)uVar24) {
        uVar22 = uVar24;
      }
      uVar20 = pu1_src[0x40] + uVar27 + (uint)pu1_src[0x20] * -2;
      uVar24 = -uVar20;
      if (0 < (int)uVar20) {
        uVar24 = uVar20;
      }
      bVar21 = 7 < uVar24 || 7 < uVar22;
    }
    local_118 = bVar1;
    bVar2 = pu1_src[uVar19];
    pbVar23 = auStack_117 + (uVar19 - 1);
    *pbVar23 = bVar2;
    if (bVar21) {
      local_118 = bVar1;
      lVar26 = 0;
      auVar29 = pmovsxbw(in_XMM0,0x202020202020202);
      for (; SBORROW8(lVar26,uVar19) != lVar26 + lVar25 * -4 < 0; lVar26 = lVar26 + 0x10) {
        auVar40 = *(undefined1 (*) [16])(pu1_src + lVar26);
        auVar48 = *(undefined1 (*) [16])(pu1_src + lVar26 + 8);
        auVar49 = pmovzxbw(in_XMM4,auVar40);
        auVar31 = pmovzxbw(auVar40 >> 8,auVar40 >> 8);
        auVar40 = pmovzxbw(auVar40 >> 0x10,auVar40 >> 0x10);
        uVar30 = (ushort)(auVar31._0_2_ * 2 + auVar40._0_2_ + auVar49._0_2_ + auVar29._0_2_) >> 2;
        uVar32 = (ushort)(auVar31._2_2_ * 2 + auVar40._2_2_ + auVar49._2_2_ + auVar29._2_2_) >> 2;
        uVar33 = (ushort)(auVar31._4_2_ * 2 + auVar40._4_2_ + auVar49._4_2_ + auVar29._4_2_) >> 2;
        uVar34 = (ushort)(auVar31._6_2_ * 2 + auVar40._6_2_ + auVar49._6_2_ + auVar29._6_2_) >> 2;
        uVar35 = (ushort)(auVar31._8_2_ * 2 + auVar40._8_2_ + auVar49._8_2_ + auVar29._8_2_) >> 2;
        uVar36 = (ushort)(auVar31._10_2_ * 2 + auVar40._10_2_ + auVar49._10_2_ + auVar29._10_2_) >>
                 2;
        uVar37 = (ushort)(auVar31._12_2_ * 2 + auVar40._12_2_ + auVar49._12_2_ + auVar29._12_2_) >>
                 2;
        uVar38 = (ushort)(auVar31._14_2_ * 2 + auVar40._14_2_ + auVar49._14_2_ + auVar29._14_2_) >>
                 2;
        in_XMM4 = pmovzxbw(auVar49,auVar48);
        auVar40 = pmovzxbw(auVar48 >> 8,auVar48 >> 8);
        auVar48 = pmovzxbw(auVar48 >> 0x10,auVar48 >> 0x10);
        uVar39 = (ushort)(auVar40._0_2_ * 2 + auVar48._0_2_ + in_XMM4._0_2_ + auVar29._0_2_) >> 2;
        uVar41 = (ushort)(auVar40._2_2_ * 2 + auVar48._2_2_ + in_XMM4._2_2_ + auVar29._2_2_) >> 2;
        uVar42 = (ushort)(auVar40._4_2_ * 2 + auVar48._4_2_ + in_XMM4._4_2_ + auVar29._4_2_) >> 2;
        uVar43 = (ushort)(auVar40._6_2_ * 2 + auVar48._6_2_ + in_XMM4._6_2_ + auVar29._6_2_) >> 2;
        uVar44 = (ushort)(auVar40._8_2_ * 2 + auVar48._8_2_ + in_XMM4._8_2_ + auVar29._8_2_) >> 2;
        uVar45 = (ushort)(auVar40._10_2_ * 2 + auVar48._10_2_ + in_XMM4._10_2_ + auVar29._10_2_) >>
                 2;
        uVar46 = (ushort)(auVar40._12_2_ * 2 + auVar48._12_2_ + in_XMM4._12_2_ + auVar29._12_2_) >>
                 2;
        uVar47 = (ushort)(auVar40._14_2_ * 2 + auVar48._14_2_ + in_XMM4._14_2_ + auVar29._14_2_) >>
                 2;
        auStack_117[lVar26] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
        auStack_117[lVar26 + 1] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
        acStack_115[lVar26] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
        acStack_115[lVar26 + 1] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
        acStack_115[lVar26 + 2] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
        acStack_115[lVar26 + 3] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
        acStack_115[lVar26 + 4] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
        *(char *)((long)&uStack_110 + lVar26) =
             (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
        *(char *)((long)&uStack_110 + lVar26 + 1) =
             (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
        *(char *)((long)&uStack_110 + lVar26 + 2) =
             (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
        *(char *)((long)&uStack_110 + lVar26 + 3) =
             (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
        *(char *)((long)&uStack_110 + lVar26 + 4) =
             (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
        *(char *)((long)&uStack_110 + lVar26 + 5) =
             (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
        *(char *)((long)&uStack_110 + lVar26 + 6) =
             (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
        *(char *)((long)&uStack_110 + lVar26 + 7) =
             (uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 - (0xff < uVar46);
        *(char *)((long)&local_108 + lVar26) =
             (uVar47 != 0) * (uVar47 < 0x100) * (char)uVar47 - (0xff < uVar47);
      }
      *pbVar23 = bVar2;
    }
    else {
      lVar26 = lVar25 * 2;
      bVar1 = pu1_src[lVar25 * 2];
      auStack_117[lVar25 * 2 + -1] = bVar1;
      uVar22 = (uint)bVar1;
      uVar24 = ((int)lVar26 + -1) * uVar27 + uVar22 + 0x20;
      for (lVar28 = 1; SBORROW8(lVar28,lVar26) != lVar28 + lVar25 * -2 < 0; lVar28 = lVar28 + 1) {
        auStack_117[lVar28 + -1] = (char)(uVar24 >> 6);
        uVar24 = uVar24 + (uVar22 - uVar27);
      }
      uVar27 = ((int)lVar26 + -1) * uVar22 + (uint)bVar2 + 0x20;
      for (lVar28 = 1; SBORROW8(lVar28,lVar26) != lVar28 + lVar25 * -2 < 0; lVar28 = lVar28 + 1) {
        auStack_117[lVar28 + lVar26 + -1] = (char)(uVar27 >> 6);
        uVar27 = uVar27 + (bVar2 - uVar22);
      }
    }
    if (nt == 0x10) {
      *(ulong *)pu1_dst = CONCAT71(_auStack_117,local_118);
      *(undefined8 *)(pu1_dst + 8) = uStack_110;
      *(undefined8 *)(pu1_dst + 0x10) = local_108;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_100;
      *(undefined8 *)(pu1_dst + 0x20) = local_f8;
      *(undefined8 *)(pu1_dst + 0x28) = uStack_f0;
      *(undefined8 *)(pu1_dst + 0x30) = local_e8;
      *(undefined8 *)(pu1_dst + 0x38) = uStack_e0;
    }
    else if (nt == 8) {
      *(ulong *)pu1_dst = CONCAT71(_auStack_117,local_118);
      *(undefined8 *)(pu1_dst + 8) = uStack_110;
      *(undefined8 *)(pu1_dst + 0x10) = local_108;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_100;
    }
    else if (nt == 4) {
      *(ulong *)pu1_dst = CONCAT71(_auStack_117,local_118);
      *(undefined8 *)(pu1_dst + 8) = uStack_110;
    }
    else {
      if (nt != 0x20) {
        return;
      }
      *(ulong *)pu1_dst = CONCAT71(_auStack_117,local_118);
      *(undefined8 *)(pu1_dst + 8) = uStack_110;
      *(undefined8 *)(pu1_dst + 0x10) = local_108;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_100;
      *(undefined8 *)(pu1_dst + 0x20) = local_f8;
      *(undefined8 *)(pu1_dst + 0x28) = uStack_f0;
      *(undefined8 *)(pu1_dst + 0x30) = local_e8;
      *(undefined8 *)(pu1_dst + 0x38) = uStack_e0;
      *(undefined8 *)(pu1_dst + 0x40) = local_d8;
      *(undefined8 *)(pu1_dst + 0x48) = uStack_d0;
      *(undefined8 *)(pu1_dst + 0x50) = local_c8;
      *(undefined8 *)(pu1_dst + 0x58) = uStack_c0;
      *(undefined8 *)(pu1_dst + 0x60) = local_b8;
      *(undefined8 *)(pu1_dst + 0x68) = uStack_b0;
      *(undefined8 *)(pu1_dst + 0x70) = local_a8;
      *(undefined8 *)(pu1_dst + 0x78) = uStack_a0;
    }
  }
  pu1_dst[uVar19] = *pbVar23;
switchD_0014a54e_caseD_2:
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering_sse42(UWORD8 *pu1_src,
                                          WORD32 nt,
                                          UWORD8 *pu1_dst,
                                          WORD32 mode,
                                          WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    WORD32 dc_val = 1 << (BIT_DEPTH - 5);
    __m128i src_temp1, src_temp2, src_temp3, src_temp7;
    __m128i src_temp4, src_temp5, src_temp6, src_temp8;

    //WORD32 strong_intra_smoothing_enable_flag  = 1;



    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            if(nt == 4)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                pu1_dst[four_nt] = pu1_src[four_nt];

            }

            else if(nt == 8)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);


                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 16)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 32)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_src + 64));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_src + 80));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_src + 96));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_src + 112));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }

        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (abs(pu1_src[2 * nt] + pu1_src[4 * nt]
                                     - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (abs(pu1_src[2 * nt] + pu1_src[0]
                                      - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;
        }
        else
        {
            __m128i const_value_8x16;

            const_value_8x16 = _mm_set1_epi16(2);

            au1_flt[0] = pu1_src[0];
            au1_flt[4 * nt] = pu1_src[4 * nt];

            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt); i += 16)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src + i));
                src_temp2 = _mm_srli_si128(src_temp1, 1);
                src_temp3 = _mm_srli_si128(src_temp2, 1);

                src_temp1 =  _mm_cvtepu8_epi16(src_temp1);
                src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
                src_temp3 =  _mm_cvtepu8_epi16(src_temp3);

                src_temp2 = _mm_slli_epi16(src_temp2,  1);

                src_temp1 = _mm_add_epi16(src_temp1, src_temp2);
                src_temp1 = _mm_add_epi16(src_temp1, src_temp3);
                src_temp1 = _mm_add_epi16(src_temp1, const_value_8x16);

                src_temp1 = _mm_srai_epi16(src_temp1,  2);

                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 8 + i));
                src_temp5 = _mm_srli_si128(src_temp4, 1);
                src_temp6 = _mm_srli_si128(src_temp5, 1);

                src_temp4 =  _mm_cvtepu8_epi16(src_temp4);
                src_temp5 =  _mm_cvtepu8_epi16(src_temp5);
                src_temp6 =  _mm_cvtepu8_epi16(src_temp6);

                src_temp5 = _mm_slli_epi16(src_temp5,  1);

                src_temp4 = _mm_add_epi16(src_temp4, src_temp5);
                src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
                src_temp4 = _mm_add_epi16(src_temp4, const_value_8x16);

                src_temp4 = _mm_srai_epi16(src_temp4,  2);

                /* converting 16 bit to 8 bit */
                src_temp1 = _mm_packus_epi16(src_temp1, src_temp4);

                _mm_storeu_si128((__m128i *)(au1_flt + 1 + i), src_temp1);
            }
            au1_flt[4 * nt] = pu1_src[4 * nt];
        }

        if(nt == 4)
        {
            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 8)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 16)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

        else if(nt == 32)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            src_temp5 = _mm_loadu_si128((__m128i *)(au1_flt + 64));
            src_temp6 = _mm_loadu_si128((__m128i *)(au1_flt + 80));
            src_temp7 = _mm_loadu_si128((__m128i *)(au1_flt + 96));
            src_temp8 = _mm_loadu_si128((__m128i *)(au1_flt + 112));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

    }
}